

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto::InternalSwap(DescriptorProto *this,DescriptorProto *other)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  DescriptorProto *this_01;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *__b;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *in_RSI;
  long in_RDI;
  UnknownFieldSet *in_stack_ffffffffffffff28;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff30;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 1);
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) != 1) {
    if (((uint)*(undefined8 *)this_00 & 1) != 1) goto LAB_0050f346;
  }
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              (this_00);
  }
  else {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    ::mutable_unknown_fields_slow(in_RSI);
  }
  internal::InternalMetadataWithArena::DoSwap
            ((InternalMetadataWithArena *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
LAB_0050f346:
  std::swap<unsigned_int>((uint *)(in_RDI + 0x10),(uint *)(in_RSI + 2));
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::InternalSwap
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_ffffffffffffff30,
             (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_ffffffffffffff28);
  RepeatedPtrField<google::protobuf::DescriptorProto>::InternalSwap
            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)in_stack_ffffffffffffff30,
             (RepeatedPtrField<google::protobuf::DescriptorProto> *)in_stack_ffffffffffffff28);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::InternalSwap
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_stack_ffffffffffffff30,
             (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_stack_ffffffffffffff28);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::InternalSwap
            ((RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)
             in_stack_ffffffffffffff30,
             (RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)
             in_stack_ffffffffffffff28);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::InternalSwap
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_ffffffffffffff30,
             (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_ffffffffffffff28);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::InternalSwap
            ((RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)in_stack_ffffffffffffff30,
             (RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)in_stack_ffffffffffffff28);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::InternalSwap
            ((RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)
             in_stack_ffffffffffffff30,
             (RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)
             in_stack_ffffffffffffff28);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InternalSwap(in_stack_ffffffffffffff30,
                 (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff28);
  this_01 = (DescriptorProto *)(in_RDI + 0xd8);
  __b = in_RSI + 0x1b;
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)__b);
  std::swap<google::protobuf::MessageOptions*>
            ((MessageOptions **)(in_RDI + 0xe0),(MessageOptions **)(in_RSI + 0x1c));
  return;
}

Assistant:

void DescriptorProto::InternalSwap(DescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  field_.InternalSwap(&other->field_);
  nested_type_.InternalSwap(&other->nested_type_);
  enum_type_.InternalSwap(&other->enum_type_);
  extension_range_.InternalSwap(&other->extension_range_);
  extension_.InternalSwap(&other->extension_);
  oneof_decl_.InternalSwap(&other->oneof_decl_);
  reserved_range_.InternalSwap(&other->reserved_range_);
  reserved_name_.InternalSwap(&other->reserved_name_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
}